

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O2

int google::protobuf::compiler::PluginMain(int argc,char **argv,CodeGenerator *generator)

{
  bool bVar1;
  ostream *poVar2;
  Type *proto;
  FileDescriptor *pFVar3;
  Type *pTVar4;
  int i;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  string error;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  GeneratorResponseContext context;
  CodeGeneratorResponse response;
  DescriptorPool pool;
  CodeGeneratorRequest request;
  
  if (1 < argc) {
    poVar2 = std::operator<<((ostream *)&std::cerr,*argv);
    poVar2 = std::operator<<(poVar2,": Unknown option: ");
    poVar2 = std::operator<<(poVar2,argv[1]);
    std::endl<char,std::char_traits<char>>(poVar2);
    return 1;
  }
  CodeGeneratorRequest::CodeGeneratorRequest(&request);
  bVar1 = Message::ParseFromFileDescriptor(&request.super_Message,0);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,*argv);
    poVar2 = std::operator<<(poVar2,": protoc sent unparseable request to plugin.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar6 = 1;
    goto LAB_001a8fcb;
  }
  DescriptorPool::DescriptorPool(&pool);
  iVar5 = 0;
  uVar6 = 1;
  do {
    if (request.proto_file_.super_RepeatedPtrFieldBase.current_size_ <= iVar5) {
      parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar5 = 0;
      goto LAB_001a8dbe;
    }
    proto = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                      (&request.proto_file_.super_RepeatedPtrFieldBase,iVar5);
    pFVar3 = DescriptorPool::BuildFile(&pool,proto);
    iVar5 = iVar5 + 1;
  } while (pFVar3 != (FileDescriptor *)0x0);
  goto LAB_001a8fbe;
LAB_001a8dbe:
  if (request.file_to_generate_.super_RepeatedPtrFieldBase.current_size_ <= iVar5)
  goto LAB_001a8e03;
  pTVar4 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&request.file_to_generate_.super_RepeatedPtrFieldBase,iVar5);
  response.super_Message.super_MessageLite._vptr_MessageLite =
       (MessageLite)DescriptorPool::FindFileByName(&pool,pTVar4);
  std::
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::emplace_back<google::protobuf::FileDescriptor_const*>
            ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)&parsed_files,(FileDescriptor **)&response);
  if (parsed_files.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] == (FileDescriptor *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,*argv);
    poVar2 = std::operator<<(poVar2,
                             ": protoc asked plugin to generate a file but did not provide a descriptor for the file: "
                            );
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&request.file_to_generate_.super_RepeatedPtrFieldBase,iVar5);
    poVar2 = std::operator<<(poVar2,(string *)pTVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar6 = 1;
    goto LAB_001a8fb4;
  }
  iVar5 = iVar5 + 1;
  goto LAB_001a8dbe;
LAB_001a8e03:
  CodeGeneratorResponse::CodeGeneratorResponse(&response);
  context.super_GeneratorContext._vptr_GeneratorContext =
       (_func_int **)&PTR__GeneratorContext_00295e48;
  context.response_ = &response;
  context.parsed_files_ = &parsed_files;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)parsed_files.
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)parsed_files.
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    pFVar3 = parsed_files.
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7];
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    error._M_dataplus._M_p = (pointer)&error.field_2;
    iVar5 = (*generator->_vptr_CodeGenerator[2])
                      (generator,pFVar3,request.parameter_,&context,&error);
    if ((char)iVar5 == '\0') {
      if (error._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&error);
        goto LAB_001a8e9d;
      }
LAB_001a8efd:
      std::operator+(&local_140,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar3,
                     ": ");
      std::operator+(&local_120,&local_140,&error);
      CodeGeneratorResponse::set_error(&response,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&error);
      break;
    }
LAB_001a8e9d:
    if (error._M_string_length != 0) goto LAB_001a8efd;
    std::__cxx11::string::~string((string *)&error);
  }
  bVar1 = Message::SerializeToFileDescriptor(&response.super_Message,1);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,*argv);
    poVar2 = std::operator<<(poVar2,": Error writing to stdout.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar6 = (uint)!bVar1;
  GeneratorContext::~GeneratorContext(&context.super_GeneratorContext);
  CodeGeneratorResponse::~CodeGeneratorResponse(&response);
LAB_001a8fb4:
  std::
  _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Vector_base(&parsed_files.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
LAB_001a8fbe:
  DescriptorPool::~DescriptorPool(&pool);
LAB_001a8fcb:
  CodeGeneratorRequest::~CodeGeneratorRequest(&request);
  return uVar6;
}

Assistant:

int PluginMain(int argc, char* argv[], const CodeGenerator* generator) {

  if (argc > 1) {
    cerr << argv[0] << ": Unknown option: " << argv[1] << endl;
    return 1;
  }

#ifdef _WIN32
  _setmode(STDIN_FILENO, _O_BINARY);
  _setmode(STDOUT_FILENO, _O_BINARY);
#endif

  CodeGeneratorRequest request;
  if (!request.ParseFromFileDescriptor(STDIN_FILENO)) {
    cerr << argv[0] << ": protoc sent unparseable request to plugin." << endl;
    return 1;
  }

  DescriptorPool pool;
  for (int i = 0; i < request.proto_file_size(); i++) {
    const FileDescriptor* file = pool.BuildFile(request.proto_file(i));
    if (file == NULL) {
      // BuildFile() already wrote an error message.
      return 1;
    }
  }

  vector<const FileDescriptor*> parsed_files;
  for (int i = 0; i < request.file_to_generate_size(); i++) {
    parsed_files.push_back(pool.FindFileByName(request.file_to_generate(i)));
    if (parsed_files.back() == NULL) {
      cerr << argv[0] << ": protoc asked plugin to generate a file but "
              "did not provide a descriptor for the file: "
           << request.file_to_generate(i) << endl;
      return 1;
    }
  }

  CodeGeneratorResponse response;
  GeneratorResponseContext context(&response, parsed_files);

  for (int i = 0; i < parsed_files.size(); i++) {
    const FileDescriptor* file = parsed_files[i];

    string error;
    bool succeeded = generator->Generate(
        file, request.parameter(), &context, &error);

    if (!succeeded && error.empty()) {
      error = "Code generator returned false but provided no error "
              "description.";
    }
    if (!error.empty()) {
      response.set_error(file->name() + ": " + error);
      break;
    }
  }

  if (!response.SerializeToFileDescriptor(STDOUT_FILENO)) {
    cerr << argv[0] << ": Error writing to stdout." << endl;
    return 1;
  }

  return 0;
}